

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

MIR_type_t get_op_type(c2m_ctx_t c2m_ctx,op_t op)

{
  c2m_ctx_t c2m_ctx_local;
  
  switch(op.mir_op._8_1_) {
  case (BADTYPE)0x1:
    c2m_ctx_local._4_4_ = reg_type(c2m_ctx,op.mir_op.u.reg);
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x284a,"MIR_type_t get_op_type(c2m_ctx_t, op_t)");
  case (BADTYPE)0x3:
    c2m_ctx_local._4_4_ = MIR_T_I64;
    break;
  case (BADTYPE)0x4:
    c2m_ctx_local._4_4_ = MIR_T_U64;
    break;
  case (BADTYPE)0x5:
    c2m_ctx_local._4_4_ = MIR_T_F;
    break;
  case (BADTYPE)0x6:
    c2m_ctx_local._4_4_ = MIR_T_D;
    break;
  case (BADTYPE)0x7:
    c2m_ctx_local._4_4_ = MIR_T_LD;
    break;
  case (BADTYPE)0xa:
    c2m_ctx_local._4_4_ = (MIR_type_t)(byte)op.mir_op.u.reg._0_1_;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static MIR_type_t get_op_type (c2m_ctx_t c2m_ctx, op_t op) {
  switch (op.mir_op.mode) {
  case MIR_OP_MEM: return op.mir_op.u.mem.type;
  case MIR_OP_REG: return reg_type (c2m_ctx, op.mir_op.u.reg);
  case MIR_OP_INT: return MIR_T_I64;
  case MIR_OP_UINT: return MIR_T_U64;
  case MIR_OP_FLOAT: return MIR_T_F;
  case MIR_OP_DOUBLE: return MIR_T_D;
  case MIR_OP_LDOUBLE: return MIR_T_LD;
  default: assert (FALSE); return MIR_T_I64;
  }
}